

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O0

void nng_device_aio(nng_aio *aio,nng_socket s1,nng_socket s2)

{
  nni_sock *local_30;
  nni_sock *sock2;
  nni_sock *sock1;
  nng_aio *pnStack_18;
  int rv;
  nng_aio *aio_local;
  nng_socket s2_local;
  nng_socket s1_local;
  
  sock2 = (nni_sock *)0x0;
  local_30 = (nni_sock *)0x0;
  pnStack_18 = aio;
  aio_local._0_4_ = s2.id;
  aio_local._4_4_ = s1.id;
  nni_aio_reset(aio);
  if ((aio_local._4_4_ != 0) && (aio_local._4_4_ != 0xffffffff)) {
    sock1._4_4_ = nni_sock_find(&sock2,aio_local._4_4_);
    if (sock1._4_4_ != NNG_OK) {
      nni_aio_finish_error(pnStack_18,sock1._4_4_);
      return;
    }
    sock1._4_4_ = 0;
  }
  if (((aio_local._0_4_ != 0) && (aio_local._0_4_ != 0xffffffff)) &&
     (aio_local._0_4_ != aio_local._4_4_)) {
    sock1._4_4_ = nni_sock_find(&local_30,aio_local._0_4_);
    if (sock1._4_4_ != NNG_OK) {
      nni_sock_rele(sock2);
      nni_aio_finish_error(pnStack_18,sock1._4_4_);
      return;
    }
    sock1._4_4_ = 0;
  }
  nni_device(pnStack_18,sock2,local_30);
  if (sock2 != (nni_sock *)0x0) {
    nni_sock_rele(sock2);
  }
  if (local_30 != (nni_sock *)0x0) {
    nni_sock_rele(local_30);
  }
  return;
}

Assistant:

void
nng_device_aio(nng_aio *aio, nng_socket s1, nng_socket s2)
{
	int       rv;
	nni_sock *sock1 = NULL;
	nni_sock *sock2 = NULL;

	nni_aio_reset(aio);
	if ((s1.id > 0) && (s1.id != (uint32_t) -1)) {
		if ((rv = nni_sock_find(&sock1, s1.id)) != 0) {
			nni_aio_finish_error(aio, rv);
			return;
		}
	}
	if (((s2.id > 0) && (s2.id != (uint32_t) -1)) && (s2.id != s1.id)) {
		if ((rv = nni_sock_find(&sock2, s2.id)) != 0) {
			nni_sock_rele(sock1);
			nni_aio_finish_error(aio, rv);
			return;
		}
	}

	nni_device(aio, sock1, sock2);
	if (sock1 != NULL) {
		nni_sock_rele(sock1);
	}
	if (sock2 != NULL) {
		nni_sock_rele(sock2);
	}
}